

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_R_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Data_Query_R_PDU::Decode(Data_Query_R_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  int iVar3;
  ushort local_60;
  ushort local_5e;
  uint local_5c;
  KUINT16 i_1;
  KUINT16 i;
  KUINT32 tmp;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Data_Query_R_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x2c) {
    i._1_1_ = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    i._1_1_ = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Simulation_Management_Header::Decode
            ((Simulation_Management_Header *)this,pKStack_18,(bool)(local_19 & 1));
  Reliability_Header::Decode(&this->super_Reliability_Header,pKStack_18);
  pKVar2 = KDataStream::operator>>(pKStack_18,&(this->super_Data_Query_PDU).m_ui32RequestID);
  pKVar2 = DATA_TYPE::operator>>
                     (pKVar2,&(this->super_Data_Query_PDU).m_TimeInterval.super_DataTypeBase);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_Data_Query_PDU).m_ui32NumFixedDatum);
  KDataStream::operator>>(pKVar2,&(this->super_Data_Query_PDU).m_ui32NumVariableDatum);
  local_5c = 0;
  for (local_5e = 0; (uint)local_5e < (this->super_Data_Query_PDU).m_ui32NumFixedDatum;
      local_5e = local_5e + 1) {
    KDataStream::operator>>(pKStack_18,&local_5c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&(this->super_Data_Query_PDU).m_vFixedDatum,&local_5c);
  }
  for (local_60 = 0; (uint)local_60 < (this->super_Data_Query_PDU).m_ui32NumVariableDatum;
      local_60 = local_60 + 1) {
    KDataStream::operator>>(pKStack_18,&local_5c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&(this->super_Data_Query_PDU).m_vVariableDatum,&local_5c);
  }
  return;
}

Assistant:

void Data_Query_R_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < DATA_QUERY_R_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Simulation_Management_Header::Decode( stream, ignoreHeader );
    Reliability_Header::Decode( stream );

    stream >> m_ui32RequestID
           >> KDIS_STREAM m_TimeInterval
           >> m_ui32NumFixedDatum
           >> m_ui32NumVariableDatum;

    KUINT32 tmp = 0;

    // FixedDatum
    for( KUINT16 i = 0; i < m_ui32NumFixedDatum; ++i )
    {
        stream >> tmp;
        m_vFixedDatum.push_back( tmp );
    }

    // VariableDatum
    for( KUINT16 i = 0; i < m_ui32NumVariableDatum; ++i )
    {
        stream >> tmp;
        m_vVariableDatum.push_back( tmp );
    }
}